

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsMipSolverData.cpp
# Opt level: O3

void __thiscall HighsMipSolverData::printSolutionSourceKey(HighsMipSolverData *this)

{
  HighsOptions *pHVar1;
  uint uVar2;
  ostream *poVar3;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar4;
  int iVar5;
  char *pcVar6;
  HighsMipSolverData *this_00;
  long lVar7;
  initializer_list<int> __l;
  vector<int,_std::allocator<int>_> limits;
  stringstream ss;
  string local_220;
  uint local_1fc;
  string local_1f8;
  HighsMipSolverData *local_1d8;
  vector<int,_std::allocator<int>_> local_1d0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  local_1d8 = this;
  std::__cxx11::stringstream::stringstream(local_1b8);
  local_220._M_dataplus._M_p = (pointer)0xa00000005;
  local_220._M_string_length = CONCAT44(local_220._M_string_length._4_4_,0xf);
  __l._M_len = 3;
  __l._M_array = (iterator)&local_220;
  std::vector<int,_std::allocator<int>_>::vector(&local_1d0,__l,(allocator_type *)&local_1f8);
  local_220._M_string_length = 0;
  local_220.field_2._M_local_buf[0] = '\0';
  local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != &local_220.field_2) {
    operator_delete(local_220._M_dataplus._M_p);
  }
  if (0 < *local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_start) {
    iVar5 = 0;
    do {
      pcVar6 = "; ";
      if (iVar5 == 0) {
        pcVar6 = "\nSrc: ";
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,pcVar6,(ulong)(iVar5 == 0) * 4 + 2);
      solutionSourceToString_abi_cxx11_(&local_220,(HighsMipSolverData *)pcVar6,iVar5,true);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      pcVar6 = " => ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
      solutionSourceToString_abi_cxx11_(&local_1f8,(HighsMipSolverData *)pcVar6,iVar5,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
      iVar5 = iVar5 + 1;
    } while (iVar5 < *local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
  }
  pHVar1 = local_1d8->mipsolver->options_mip_;
  std::__cxx11::stringbuf::str();
  highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,"%s;\n",
               local_220._M_dataplus._M_p);
  paVar4 = &local_220.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_220._M_dataplus._M_p != paVar4) {
    operator_delete(local_220._M_dataplus._M_p);
    paVar4 = extraout_RAX;
  }
  local_1fc = (uint)CONCAT71((int7)((ulong)paVar4 >> 8),1);
  lVar7 = 0;
  do {
    local_220._M_string_length = 0;
    local_220.field_2._M_local_buf[0] = '\0';
    local_220._M_dataplus._M_p = (pointer)&local_220.field_2;
    std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    for (iVar5 = local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start[lVar7];
        iVar5 < local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start[lVar7 + 1]; iVar5 = iVar5 + 1) {
      this_00 = (HighsMipSolverData *)0x3cca39;
      if (iVar5 == local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start[lVar7]) {
        this_00 = (HighsMipSolverData *)0x3d8d03;
      }
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,(char *)this_00,
                 (ulong)(iVar5 == local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start[lVar7]) * 3 + 2);
      solutionSourceToString_abi_cxx11_(&local_220,this_00,iVar5,true);
      poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)local_1a8,local_220._M_dataplus._M_p,local_220._M_string_length
                         );
      pcVar6 = " => ";
      std::__ostream_insert<char,std::char_traits<char>>(poVar3," => ",4);
      solutionSourceToString_abi_cxx11_(&local_1f8,(HighsMipSolverData *)pcVar6,iVar5,false);
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar3,local_1f8._M_dataplus._M_p,local_1f8._M_string_length);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1f8._M_dataplus._M_p != &local_1f8.field_2) {
        operator_delete(local_1f8._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_220._M_dataplus._M_p != &local_220.field_2) {
        operator_delete(local_220._M_dataplus._M_p);
      }
    }
    pHVar1 = local_1d8->mipsolver->options_mip_;
    std::__cxx11::stringbuf::str();
    pcVar6 = "";
    if ((local_1fc & 1) != 0) {
      pcVar6 = ";";
    }
    highsLogUser(&(pHVar1->super_HighsOptionsStruct).log_options,kInfo,"%s%s\n",
                 local_220._M_dataplus._M_p,pcVar6);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_220._M_dataplus._M_p != &local_220.field_2) {
      operator_delete(local_220._M_dataplus._M_p);
    }
    lVar7 = 1;
    uVar2 = local_1fc & 1;
    local_1fc = 0;
  } while (uVar2 != 0);
  if (local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
      _M_start != (int *)0x0) {
    operator_delete(local_1d0.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void HighsMipSolverData::printSolutionSourceKey() {
  std::stringstream ss;
  // Last MipSolutionSource enum is kSolutionSourceCleanup - which is
  // not a solution source, but used to force the last logging line to
  // be printed
  const int last_enum = kSolutionSourceCount - 1;
  int third_list = 5;
  int two_third_list = 10;
  std::vector<int> limits = {third_list, two_third_list, last_enum};

  ss.str(std::string());
  for (int k = 0; k < limits[0]; k++) {
    if (k == 0) {
      ss << "\nSrc: ";
    } else {
      ss << "; ";
    }
    ss << solutionSourceToString(k) << " => "
       << solutionSourceToString(k, false);
  }
  highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
               "%s;\n", ss.str().c_str());
  for (int line = 0; line < 2; line++) {
    ss.str(std::string());
    for (int k = limits[line]; k < limits[line + 1]; k++) {
      if (k == limits[line]) {
        ss << "     ";
      } else {
        ss << "; ";
      }
      ss << solutionSourceToString(k) << " => "
         << solutionSourceToString(k, false);
    }
    highsLogUser(mipsolver.options_mip_->log_options, HighsLogType::kInfo,
                 "%s%s\n", ss.str().c_str(), line == 0 ? ";" : "");
  }
}